

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitGetObjectMethod(RegSlot methodReg,RegSlot objectReg,PropertyId propertyId,
                        ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  uint cacheId_00;
  ByteCodeWriter *this;
  uint cacheId;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  PropertyId propertyId_local;
  RegSlot objectReg_local;
  RegSlot methodReg_local;
  
  cacheId_00 = FuncInfo::FindOrAddInlineCacheId(funcInfo,objectReg,propertyId,true,false);
  this = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::PatchableProperty(this,LdMethodFld,methodReg,objectReg,cacheId_00,false,true);
  return;
}

Assistant:

void EmitGetObjectMethod(
    Js::RegSlot methodReg,
    Js::RegSlot objectReg,
    Js::PropertyId propertyId,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    uint cacheId = funcInfo->FindOrAddInlineCacheId(
        objectReg,
        propertyId,
        /* isLoadMethod */ true,
        /* isStore */ false);

    byteCodeGenerator->Writer()->PatchableProperty(
        Js::OpCode::LdMethodFld,
        methodReg,
        objectReg,
        cacheId,
        /* isCtor */ false,
        /* registerCacheIdForCall */ true);
}